

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void jpeg_gen_optimal_table(j_compress_ptr cinfo,JHUFF_TBL *htbl,long *freq)

{
  long local_888;
  long v;
  int local_878;
  int j;
  int i;
  int p;
  int c2;
  int c1;
  int others [257];
  int local_458 [2];
  int codesize [257];
  undefined8 local_48;
  UINT8 bits [33];
  long *freq_local;
  JHUFF_TBL *htbl_local;
  j_compress_ptr cinfo_local;
  
  unique0x10000662 = freq;
  memset(&local_48,0,0x21);
  memset(local_458,0,0x404);
  for (local_878 = 0; local_878 < 0x101; local_878 = local_878 + 1) {
    (&c2)[local_878] = -1;
  }
  stack0xffffffffffffffe0[0x100] = 1;
  while( true ) {
    p = -1;
    local_888 = 1000000000;
    for (local_878 = 0; local_878 < 0x101; local_878 = local_878 + 1) {
      if ((stack0xffffffffffffffe0[local_878] != 0) &&
         (stack0xffffffffffffffe0[local_878] <= local_888)) {
        local_888 = stack0xffffffffffffffe0[local_878];
        p = local_878;
      }
    }
    i = -1;
    local_888 = 1000000000;
    for (local_878 = 0; local_878 < 0x101; local_878 = local_878 + 1) {
      if (((stack0xffffffffffffffe0[local_878] != 0) &&
          (stack0xffffffffffffffe0[local_878] <= local_888)) && (local_878 != p)) {
        local_888 = stack0xffffffffffffffe0[local_878];
        i = local_878;
      }
    }
    if (i < 0) break;
    stack0xffffffffffffffe0[p] = stack0xffffffffffffffe0[i] + stack0xffffffffffffffe0[p];
    stack0xffffffffffffffe0[i] = 0;
    local_458[p] = local_458[p] + 1;
    while (-1 < (&c2)[p]) {
      p = (&c2)[p];
      local_458[p] = local_458[p] + 1;
    }
    (&c2)[p] = i;
    local_458[i] = local_458[i] + 1;
    while (-1 < (&c2)[i]) {
      i = (&c2)[i];
      local_458[i] = local_458[i] + 1;
    }
  }
  for (local_878 = 0; local_878 < 0x101; local_878 = local_878 + 1) {
    if (local_458[local_878] != 0) {
      if (0x20 < local_458[local_878]) {
        cinfo->err->msg_code = 0x28;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      bits[(long)local_458[local_878] + -8] = bits[(long)local_458[local_878] + -8] + '\x01';
    }
  }
  for (local_878 = 0x20; 0x10 < local_878; local_878 = local_878 + -1) {
    while (bits[(long)local_878 + -8] != '\0') {
      v._4_4_ = local_878 + -2;
      while (bits[(long)v._4_4_ + -8] == '\0') {
        v._4_4_ = v._4_4_ + -1;
      }
      bits[(long)local_878 + -8] = bits[(long)local_878 + -8] + 0xfe;
      bits[(long)(local_878 + -1) + -8] = bits[(long)(local_878 + -1) + -8] + '\x01';
      bits[(long)(v._4_4_ + 1) + -8] = bits[(long)(v._4_4_ + 1) + -8] + '\x02';
      bits[(long)v._4_4_ + -8] = bits[(long)v._4_4_ + -8] + 0xff;
    }
  }
  while (bits[(long)local_878 + -8] == '\0') {
    local_878 = local_878 + -1;
  }
  bits[(long)local_878 + -8] = bits[(long)local_878 + -8] + 0xff;
  *(undefined8 *)htbl->bits = local_48;
  *(undefined8 *)(htbl->bits + 8) = bits._0_8_;
  htbl->bits[0x10] = bits[8];
  j = 0;
  for (local_878 = 1; local_878 < 0x21; local_878 = local_878 + 1) {
    for (v._4_4_ = 0; v._4_4_ < 0x100; v._4_4_ = v._4_4_ + 1) {
      if (local_458[v._4_4_] == local_878) {
        htbl->huffval[j] = (UINT8)v._4_4_;
        j = j + 1;
      }
    }
  }
  htbl->sent_table = 0;
  return;
}

Assistant:

LOCAL(void)
jpeg_gen_optimal_table (j_compress_ptr cinfo, JHUFF_TBL * htbl, long freq[])
{
#define MAX_CLEN 32		/* assumed maximum initial code length */
  UINT8 bits[MAX_CLEN+1];	/* bits[k] = # of symbols with code length k */
  int codesize[257];		/* codesize[k] = code length of symbol k */
  int others[257];		/* next symbol in current branch of tree */
  int c1, c2;
  int p, i, j;
  long v;

  /* This algorithm is explained in section K.2 of the JPEG standard */

  MEMZERO(bits, SIZEOF(bits));
  MEMZERO(codesize, SIZEOF(codesize));
  for (i = 0; i < 257; i++)
    others[i] = -1;		/* init links to empty */
  
  freq[256] = 1;		/* make sure 256 has a nonzero count */
  /* Including the pseudo-symbol 256 in the Huffman procedure guarantees
   * that no real symbol is given code-value of all ones, because 256
   * will be placed last in the largest codeword category.
   */

  /* Huffman's basic algorithm to assign optimal code lengths to symbols */

  for (;;) {
    /* Find the smallest nonzero frequency, set c1 = its symbol */
    /* In case of ties, take the larger symbol number */
    c1 = -1;
    v = 1000000000L;
    for (i = 0; i <= 256; i++) {
      if (freq[i] && freq[i] <= v) {
	v = freq[i];
	c1 = i;
      }
    }

    /* Find the next smallest nonzero frequency, set c2 = its symbol */
    /* In case of ties, take the larger symbol number */
    c2 = -1;
    v = 1000000000L;
    for (i = 0; i <= 256; i++) {
      if (freq[i] && freq[i] <= v && i != c1) {
	v = freq[i];
	c2 = i;
      }
    }

    /* Done if we've merged everything into one frequency */
    if (c2 < 0)
      break;
    
    /* Else merge the two counts/trees */
    freq[c1] += freq[c2];
    freq[c2] = 0;

    /* Increment the codesize of everything in c1's tree branch */
    codesize[c1]++;
    while (others[c1] >= 0) {
      c1 = others[c1];
      codesize[c1]++;
    }
    
    others[c1] = c2;		/* chain c2 onto c1's tree branch */
    
    /* Increment the codesize of everything in c2's tree branch */
    codesize[c2]++;
    while (others[c2] >= 0) {
      c2 = others[c2];
      codesize[c2]++;
    }
  }

  /* Now count the number of symbols of each code length */
  for (i = 0; i <= 256; i++) {
    if (codesize[i]) {
      /* The JPEG standard seems to think that this can't happen, */
      /* but I'm paranoid... */
      if (codesize[i] > MAX_CLEN)
	ERREXIT(cinfo, JERR_HUFF_CLEN_OVERFLOW);

      bits[codesize[i]]++;
    }
  }

  /* JPEG doesn't allow symbols with code lengths over 16 bits, so if the pure
   * Huffman procedure assigned any such lengths, we must adjust the coding.
   * Here is what the JPEG spec says about how this next bit works:
   * Since symbols are paired for the longest Huffman code, the symbols are
   * removed from this length category two at a time.  The prefix for the pair
   * (which is one bit shorter) is allocated to one of the pair; then,
   * skipping the BITS entry for that prefix length, a code word from the next
   * shortest nonzero BITS entry is converted into a prefix for two code words
   * one bit longer.
   */
  
  for (i = MAX_CLEN; i > 16; i--) {
    while (bits[i] > 0) {
      j = i - 2;		/* find length of new prefix to be used */
      while (bits[j] == 0)
	j--;
      
      bits[i] -= 2;		/* remove two symbols */
      bits[i-1]++;		/* one goes in this length */
      bits[j+1] += 2;		/* two new symbols in this length */
      bits[j]--;		/* symbol of this length is now a prefix */
    }
  }

  /* Remove the count for the pseudo-symbol 256 from the largest codelength */
  while (bits[i] == 0)		/* find largest codelength still in use */
    i--;
  bits[i]--;
  
  /* Return final symbol counts (only for lengths 0..16) */
  MEMCOPY(htbl->bits, bits, SIZEOF(htbl->bits));
  
  /* Return a list of the symbols sorted by code length */
  /* It's not real clear to me why we don't need to consider the codelength
   * changes made above, but the JPEG spec seems to think this works.
   */
  p = 0;
  for (i = 1; i <= MAX_CLEN; i++) {
    for (j = 0; j <= 255; j++) {
      if (codesize[j] == i) {
	htbl->huffval[p] = (UINT8) j;
	p++;
      }
    }
  }

  /* Set sent_table FALSE so updated table will be written to JPEG file. */
  htbl->sent_table = FALSE;
}